

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializable.cpp
# Opt level: O3

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* blc::tools::serializable::cut
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *str,char cut)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  undefined7 in_register_00000011;
  string after;
  string before;
  allocator<char> local_89;
  char *local_88;
  size_type *local_80;
  size_type local_78;
  size_type local_70;
  undefined8 uStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar3 = std::__cxx11::string::find((char)str,CONCAT71(in_register_00000011,cut) & 0xffffffff);
  std::__cxx11::string::substr((ulong)&local_40,(ulong)str);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)str);
  if (iVar3 == -1) {
    local_88 = "";
    pcVar2 = (str->_M_dataplus)._M_p;
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + str->_M_string_length);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_88,&local_89);
    paVar1 = &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)paVar1;
    if (local_80 == &local_70) {
      paVar1->_M_allocated_capacity = local_70;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl.field_2 + 8) = uStack_68;
    }
    else {
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_dataplus._M_p = (pointer)local_80;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl.field_2._M_allocated_capacity = local_70;
    }
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = local_78;
  }
  else {
    std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
              ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__,
               &local_40,&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, std::string> blc::tools::serializable::cut(const std::string &str, char cut) {
	int 		i = str.find(cut);
	std::string	before = str.substr(0, i);
	std::string	after = str.substr(i + 1, str.size());

	if (i == -1)
		return (std::make_tuple(str, ""));
	return (std::make_tuple(before, after));
}